

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

bool __thiscall VertexAttrib64Bit::LimitTest::testIteration(LimitTest *this,_iteration iteration)

{
  GLuint program_id;
  GLuint program_id_00;
  GLuint program_id_01;
  GLuint program_id_02;
  bool bVar1;
  bool bVar2;
  GLenum err;
  programInfo use_array_use_location_per_instance;
  programInfo _no_array_use_location_per_instance;
  programInfo use_array__no_location_per_instance;
  programInfo _no_array__no_location_per_instance;
  programInfo use_array_use_location______regular;
  programInfo _no_array_use_location______regular;
  programInfo use_array__no_location______regular;
  programInfo _no_array__no_location______regular;
  programInfo local_f0;
  programInfo local_d8;
  programInfo local_c0;
  programInfo local_a8;
  programInfo local_90;
  programInfo local_78;
  programInfo local_60;
  programInfo local_48;
  
  local_f0.gl = &(this->super_Base).gl;
  local_48.m_fragment_shader_id = 0;
  local_48.m_program_id = 0;
  local_48.m_vertex_shader_id = 0;
  local_60.m_fragment_shader_id = 0;
  local_60.m_program_id = 0;
  local_60.m_vertex_shader_id = 0;
  local_78.m_fragment_shader_id = 0;
  local_78.m_program_id = 0;
  local_78.m_vertex_shader_id = 0;
  local_90.m_fragment_shader_id = 0;
  local_90.m_program_id = 0;
  local_90.m_vertex_shader_id = 0;
  local_a8.m_fragment_shader_id = 0;
  local_a8.m_program_id = 0;
  local_a8.m_vertex_shader_id = 0;
  local_c0.m_fragment_shader_id = 0;
  local_c0.m_program_id = 0;
  local_c0.m_vertex_shader_id = 0;
  local_d8.m_fragment_shader_id = 0;
  local_d8.m_program_id = 0;
  local_d8.m_vertex_shader_id = 0;
  local_f0.m_fragment_shader_id = 0;
  local_f0.m_program_id = 0;
  local_f0.m_vertex_shader_id = 0;
  local_d8.gl = local_f0.gl;
  local_c0.gl = local_f0.gl;
  local_a8.gl = local_f0.gl;
  local_90.gl = local_f0.gl;
  local_78.gl = local_f0.gl;
  local_60.gl = local_f0.gl;
  local_48.gl = local_f0.gl;
  prepareProgram(this,iteration,false,false,false,&local_48);
  prepareProgram(this,iteration,true,false,false,&local_60);
  prepareProgram(this,iteration,false,true,false,&local_78);
  prepareProgram(this,iteration,true,true,false,&local_90);
  prepareProgram(this,iteration,false,false,true,&local_a8);
  prepareProgram(this,iteration,true,false,true,&local_c0);
  prepareProgram(this,iteration,false,true,true,&local_d8);
  prepareProgram(this,iteration,true,true,true,&local_f0);
  (*(this->super_Base).gl.bindBuffer)(0x8893,this->m_element_array_buffer_id);
  (*(this->super_Base).gl.bindBufferRange)(0x8c8e,0,this->m_transoform_feedback_buffer_id,0,0x10000)
  ;
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xabe);
  prepareVertexArrayBuffer(this,iteration);
  bVar1 = testProgram(this,iteration,local_48.m_program_id,false);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,REGULAR,false,false);
  }
  bVar2 = testProgram(this,iteration,local_60.m_program_id,true);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,REGULAR,true,false);
  }
  bVar2 = testProgram(this,iteration,local_78.m_program_id,false);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,REGULAR,false,true);
  }
  bVar2 = testProgram(this,iteration,local_90.m_program_id,true);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,REGULAR,true,true);
  }
  program_id_02 = local_a8.m_program_id;
  bVar2 = testProgramWithConstant(this,iteration,local_a8.m_program_id,false);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,CONSTANT,false,false);
  }
  program_id_01 = local_c0.m_program_id;
  bVar2 = testProgramWithConstant(this,iteration,local_c0.m_program_id,true);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,CONSTANT,true,false);
  }
  program_id_00 = local_d8.m_program_id;
  bVar2 = testProgramWithConstant(this,iteration,local_d8.m_program_id,false);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,CONSTANT,false,true);
  }
  program_id = local_f0.m_program_id;
  bVar2 = testProgramWithConstant(this,iteration,local_f0.m_program_id,true);
  if (!bVar2) {
    logTestIterationAndConfig(this,iteration,CONSTANT,true,true);
    bVar1 = false;
  }
  bVar2 = testProgramWithDivisor(this,iteration,program_id_02,false);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,false,false);
  }
  bVar2 = testProgramWithDivisor(this,iteration,program_id_01,true);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,true,false);
  }
  bVar2 = testProgramWithDivisor(this,iteration,program_id_00,false);
  if (!bVar2) {
    bVar1 = false;
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,false,true);
  }
  bVar2 = testProgramWithDivisor(this,iteration,program_id,true);
  if (!bVar2) {
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,true,true);
    bVar1 = false;
  }
  programInfo::~programInfo(&local_f0);
  programInfo::~programInfo(&local_d8);
  programInfo::~programInfo(&local_c0);
  programInfo::~programInfo(&local_a8);
  programInfo::~programInfo(&local_90);
  programInfo::~programInfo(&local_78);
  programInfo::~programInfo(&local_60);
  programInfo::~programInfo(&local_48);
  return bVar1;
}

Assistant:

bool LimitTest::testIteration(_iteration iteration)
{
	bool result = true;

	/* Program infos */
	programInfo _no_array__no_location______regular(gl);
	programInfo use_array__no_location______regular(gl);
	programInfo _no_array_use_location______regular(gl);
	programInfo use_array_use_location______regular(gl);
	programInfo _no_array__no_location_per_instance(gl);
	programInfo use_array__no_location_per_instance(gl);
	programInfo _no_array_use_location_per_instance(gl);
	programInfo use_array_use_location_per_instance(gl);

	/* Prepare programs for all configuration */
	prepareProgram(iteration, false, false, false, _no_array__no_location______regular);
	prepareProgram(iteration, true, false, false, use_array__no_location______regular);
	prepareProgram(iteration, false, true, false, _no_array_use_location______regular);
	prepareProgram(iteration, true, true, false, use_array_use_location______regular);
	prepareProgram(iteration, false, false, true, _no_array__no_location_per_instance);
	prepareProgram(iteration, true, false, true, use_array__no_location_per_instance);
	prepareProgram(iteration, false, true, true, _no_array_use_location_per_instance);
	prepareProgram(iteration, true, true, true, use_array_use_location_per_instance);

	/* Bind buffers */
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_element_array_buffer_id);
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_transoform_feedback_buffer_id, 0,
					   m_transform_feedback_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	/* Prepare vertex array buffer for iteration */
	prepareVertexArrayBuffer(iteration);

	/* Regular and instanced draw calls, vertex attribute divisor: 0 */
	if (false == testProgram(iteration, _no_array__no_location______regular.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, REGULAR, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, use_array__no_location______regular.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, REGULAR, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, _no_array_use_location______regular.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, REGULAR, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, use_array_use_location______regular.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, REGULAR, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Regular draw calls, constant vertex attribute */
	if (false == testProgramWithConstant(iteration, _no_array__no_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, CONSTANT, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, use_array__no_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, CONSTANT, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, _no_array_use_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, CONSTANT, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, use_array_use_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, CONSTANT, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Instanced draw calls, vertex attribute divisor: 1 */
	if (false == testProgramWithDivisor(iteration, _no_array__no_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, use_array__no_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, _no_array_use_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, use_array_use_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Done */
	return result;
}